

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status leveldb::DB::Open(Options *options,string *dbname,DB **dbptr)

{
  bool bVar1;
  DBImpl *pDVar2;
  Writer *pWVar3;
  MemTable *pMVar4;
  undefined8 *in_RCX;
  long in_RSI;
  MemTable *in_RDI;
  DBImpl *unaff_retaddr;
  WritableFile *lfile;
  uint64_t new_log_number;
  bool save_manifest;
  VersionEdit edit;
  DBImpl *impl;
  Status *s;
  Mutex *in_stack_00000158;
  VersionEdit *in_stack_00000160;
  VersionSet *in_stack_00000168;
  WritableFile *in_stack_fffffffffffffea8;
  DBImpl *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  InternalKeyComparator *comparator;
  MemTable *this;
  string *in_stack_fffffffffffffef0;
  Options *in_stack_fffffffffffffef8;
  DBImpl *in_stack_ffffffffffffff00;
  undefined1 local_f0 [8];
  WritableFile *local_e8;
  uint64_t local_e0;
  undefined1 local_d2;
  byte local_d1;
  VersionEdit local_d0;
  DBImpl *local_28;
  undefined8 *local_20;
  long local_10;
  
  *in_RCX = 0;
  this = in_RDI;
  local_20 = in_RCX;
  local_10 = in_RSI;
  pDVar2 = (DBImpl *)operator_new(0xad8);
  DBImpl::DBImpl(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  local_28 = pDVar2;
  port::Mutex::Lock((Mutex *)0x1146cb);
  VersionEdit::VersionEdit((VersionEdit *)in_stack_fffffffffffffeb0);
  local_d1 = 0;
  local_d2 = 0;
  DBImpl::Recover((DBImpl *)
                  edit.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                  (VersionEdit *)
                  edit.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                  (bool *)edit.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                 );
  bVar1 = Status::ok((Status *)in_RDI);
  if ((bVar1) && (local_28->mem_ == (MemTable *)0x0)) {
    local_e0 = VersionSet::NewFileNumber(local_28->versions_);
    comparator = *(InternalKeyComparator **)(local_10 + 0x10);
    LogFileName(in_stack_fffffffffffffeb8,(uint64_t)in_stack_fffffffffffffeb0);
    (*(comparator->super_Comparator)._vptr_Comparator[4])
              (local_f0,comparator,&stack0xfffffffffffffef0,&local_e8);
    Status::operator=((Status *)in_stack_fffffffffffffeb0,(Status *)in_stack_fffffffffffffea8);
    Status::~Status((Status *)in_stack_fffffffffffffeb0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
    bVar1 = Status::ok((Status *)in_RDI);
    if (bVar1) {
      VersionEdit::SetLogNumber(&local_d0,local_e0);
      local_28->logfile_ = local_e8;
      local_28->logfile_number_ = local_e0;
      pWVar3 = (Writer *)operator_new(0x20);
      log::Writer::Writer((Writer *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      local_28->log_ = pWVar3;
      pMVar4 = (MemTable *)operator_new(0x70);
      MemTable::MemTable(this,comparator);
      local_28->mem_ = pMVar4;
      MemTable::Ref(local_28->mem_);
    }
  }
  bVar1 = Status::ok((Status *)in_RDI);
  if ((bVar1) && ((local_d1 & 1) != 0)) {
    VersionEdit::SetPrevLogNumber(&local_d0,0);
    VersionEdit::SetLogNumber(&local_d0,local_28->logfile_number_);
    VersionSet::LogAndApply(in_stack_00000168,in_stack_00000160,in_stack_00000158);
    Status::operator=((Status *)in_stack_fffffffffffffeb0,(Status *)in_stack_fffffffffffffea8);
    Status::~Status((Status *)in_stack_fffffffffffffeb0);
  }
  bVar1 = Status::ok((Status *)in_RDI);
  if (bVar1) {
    DBImpl::DeleteObsoleteFiles(unaff_retaddr);
    DBImpl::MaybeScheduleCompaction(in_stack_fffffffffffffeb0);
  }
  port::Mutex::Unlock((Mutex *)0x11494c);
  bVar1 = Status::ok((Status *)in_RDI);
  if (bVar1) {
    *local_20 = local_28;
  }
  else {
    in_stack_fffffffffffffeb0 = local_28;
    if (local_28 != (DBImpl *)0x0) {
      (*(local_28->super_DB)._vptr_DB[1])();
    }
  }
  local_d2 = 1;
  VersionEdit::~VersionEdit((VersionEdit *)in_stack_fffffffffffffeb0);
  return (Status)(char *)this;
}

Assistant:

Status DB::Open(const Options& options, const std::string& dbname, DB** dbptr) {
  *dbptr = nullptr;

  DBImpl* impl = new DBImpl(options, dbname);
  impl->mutex_.Lock();
  VersionEdit edit;
  // Recover handles create_if_missing, error_if_exists
  bool save_manifest = false;
  Status s = impl->Recover(&edit, &save_manifest);
  if (s.ok() && impl->mem_ == nullptr) {
    // Create new log and a corresponding memtable.
    uint64_t new_log_number = impl->versions_->NewFileNumber();
    WritableFile* lfile;
    s = options.env->NewWritableFile(LogFileName(dbname, new_log_number),
                                     &lfile);
    if (s.ok()) {
      edit.SetLogNumber(new_log_number);
      impl->logfile_ = lfile;
      impl->logfile_number_ = new_log_number;
      impl->log_ = new log::Writer(lfile);
      impl->mem_ = new MemTable(impl->internal_comparator_);
      impl->mem_->Ref();
    }
  }
  if (s.ok() && save_manifest) {
    edit.SetPrevLogNumber(0);  // No older logs needed after recovery.
    edit.SetLogNumber(impl->logfile_number_);
    s = impl->versions_->LogAndApply(&edit, &impl->mutex_);
  }
  if (s.ok()) {
    impl->DeleteObsoleteFiles();
    impl->MaybeScheduleCompaction();
  }
  impl->mutex_.Unlock();
  if (s.ok()) {
    assert(impl->mem_ != nullptr);
    *dbptr = impl;
  } else {
    delete impl;
  }
  return s;
}